

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_av.c
# Opt level: O1

dtl_av_t * dtl_av_make(dtl_dv_t **ppValue,int32_t s32Len)

{
  dtl_av_t *self;
  ulong uVar1;
  
  if (s32Len < 0) {
    self = (dtl_av_t *)0x0;
  }
  else {
    self = dtl_av_new();
    if ((self != (dtl_av_t *)0x0) && (adt_ary_extend(self->pAny,s32Len), s32Len != 0)) {
      uVar1 = 0;
      do {
        dtl_av_set(self,(int32_t)uVar1,ppValue[uVar1]);
        uVar1 = uVar1 + 1;
      } while ((uint)s32Len != uVar1);
    }
  }
  return self;
}

Assistant:

dtl_av_t* dtl_av_make(dtl_dv_t** ppValue, int32_t s32Len){
   if(s32Len<0){
      return (dtl_av_t*)0;
   }
   dtl_av_t *self = dtl_av_new();
   if(self){
      int32_t s32i;
      dtl_av_extend(self,s32Len);
      for(s32i=0;s32i<s32Len;s32i++){
         dtl_av_set(self,s32i,ppValue[s32i]);
      }
   }
   return self;
}